

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O3

uint __thiscall
Js::ScriptContext::SaveSourceNoCopy
          (ScriptContext *this,Utf8SourceInfo *sourceInfo,int cchLength,bool isCesu8)

{
  byte bVar1;
  Recycler *recycler;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  undefined4 *puVar5;
  List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>
  *this_00;
  CriticalSection *this_01;
  RecyclerWeakReferenceBase *local_38;
  RecyclerWeakReference<Js::Utf8SourceInfo> *sourceWeakRef;
  
  if ((sourceInfo->m_scriptContext).ptr != this) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                ,0xadf,"(sourceInfo->GetScriptContext() == this)",
                                "sourceInfo->GetScriptContext() == this");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  bVar3 = IsScriptContextInDebugMode(this);
  if (((bVar3) && (bVar1 = sourceInfo->field_0xa8, (bVar1 & 4) == 0)) &&
     (((bVar1 & 0x40) == 0 ||
      ((bVar1 & 0x20) == 0 && (sourceInfo->debugModeSource).ptr == (uchar *)0x0)))) {
    Utf8SourceInfo::SetInDebugMode(sourceInfo,true);
  }
  recycler = this->recycler;
  local_38 = Memory::WeakReferenceHashTable<PrimePolicy>::Add
                       (&recycler->weakReferenceMap,(char *)sourceInfo,recycler);
  if (local_38->typeInfo == (Type)0x0) {
    local_38->typeInfo = (Type)&Utf8SourceInfo::typeinfo;
    Memory::Recycler::TrackAllocWeakRef(recycler,local_38);
  }
  sourceInfo->field_0xa8 = sourceInfo->field_0xa8 & 0xfd | isCesu8 * '\x02';
  this_01 = &this->threadContext->csFunctionBody;
  CCLock::Enter(&this_01->super_CCLock);
  this_00 = Memory::
            RecyclerRootPtr<JsUtil::List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>_>
            ::operator->(&this->sourceList);
  uVar4 = JsUtil::
          List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>
          ::SetAtFirstFreeSpot(this_00,(RecyclerWeakReference<Js::Utf8SourceInfo> **)&local_38);
  CCLock::Leave(&this_01->super_CCLock);
  return uVar4;
}

Assistant:

uint ScriptContext::SaveSourceNoCopy(Utf8SourceInfo* sourceInfo, int cchLength, bool isCesu8)
    {
        Assert(sourceInfo->GetScriptContext() == this);

#ifdef ENABLE_SCRIPT_DEBUGGING
        if (this->IsScriptContextInDebugMode() && !sourceInfo->GetIsLibraryCode() && !sourceInfo->IsInDebugMode())
        {
            sourceInfo->SetInDebugMode(true);
        }
#endif

        RecyclerWeakReference<Utf8SourceInfo>* sourceWeakRef = this->GetRecycler()->CreateWeakReferenceHandle<Utf8SourceInfo>(sourceInfo);
        sourceInfo->SetIsCesu8(isCesu8);
        {
            // We can be compiling new source code while rundown thread is reading from the list, causing AV on the reader thread
            // lock the list during write as well.
            AutoCriticalSection autocs(GetThreadContext()->GetFunctionBodyLock());
            return sourceList->SetAtFirstFreeSpot(sourceWeakRef);
        }
    }